

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

SearchResult __thiscall
gss::innards::HomomorphismSearcher::restarting_search
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments,Domains *domains,
          unsigned_long_long *nodes,unsigned_long_long *propagations,loooong *solution_count,
          int depth,RestartsSchedule *restarts_schedule)

{
  pointer *ppHVar1;
  uint *puVar2;
  undefined1 *puVar3;
  BitWord *pBVar4;
  PropagateUsingLackey PVar5;
  Proof *pPVar6;
  pointer pHVar7;
  pointer pHVar8;
  ulong uVar9;
  limb_type lVar10;
  HomomorphismParams *pHVar11;
  byte bVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  pointer ppVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  SearchResult SVar21;
  undefined8 uVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  HomomorphismDomain *pHVar24;
  undefined7 extraout_var;
  loooong *plVar25;
  int iVar26;
  uint uVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  ulong uVar29;
  HomomorphismSearcher *pHVar30;
  int iVar31;
  long lVar32;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  iterator iVar33;
  HomomorphismSearcher *pHVar34;
  pointer pHVar35;
  BitWord BVar36;
  uint *puVar37;
  uint uVar38;
  bool bVar39;
  pointer pHVar40;
  uint __len;
  SearchResult SVar41;
  uint *puVar42;
  bool bVar43;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  string __str;
  undefined8 uStack_188;
  vector<int,_std::allocator<int>_> branch_v;
  undefined4 local_150;
  undefined4 local_14c;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  proof_domains;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  HomomorphismSearcher *local_118;
  Domains *local_110;
  SVOBitset remaining;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_60;
  Domains new_domains;
  
  pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110 = domains;
  if (pPVar6 != (Proof *)0x0) {
    bVar19 = Proof::super_extra_verbose(pPVar6);
    if (bVar19) {
      proof_domains.
      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      proof_domains.
      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pHVar40 = (local_110->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pHVar7 = (local_110->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar40 != pHVar7) {
        puVar3 = (undefined1 *)((long)&__str.field_2 + 8);
        do {
          HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&__str,this->model,pHVar40->v);
          remaining._data.short_data[0]._0_4_ = (uint)__str._M_dataplus._M_p;
          remaining._data.short_data[1] = __str._M_string_length;
          if ((undefined1 *)__str._M_string_length == puVar3) {
            remaining._data.short_data[4] = uStack_188;
            remaining._data.short_data[1] = (BitWord)(undefined1 *)((long)&remaining._data + 0x18);
          }
          remaining._data.short_data[2]._4_4_ = __str.field_2._M_allocated_capacity._4_4_;
          remaining._data.short_data[2]._0_4_ = __str.field_2._M_allocated_capacity._0_4_;
          remaining._data.short_data[3] = __str.field_2._8_8_;
          __str.field_2._M_allocated_capacity._0_4_ = 0;
          __str.field_2._M_allocated_capacity._4_4_ = 0;
          __str.field_2._8_8_ = __str.field_2._8_8_ & 0xffffffffffffff00;
          remaining._data.short_data[5] = 0;
          remaining._data.short_data[6] = 0;
          remaining._data.short_data[7] = 0;
          branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_16_ = ZEXT816(0) << 0x20;
          branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          __str._M_string_length = (size_type)puVar3;
          std::
          vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
          ::
          emplace_back<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>
                    ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                      *)&proof_domains,
                     (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&remaining);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)&remaining._data + 0x28));
          if ((undefined1 *)remaining._data.short_data[1] !=
              (undefined1 *)((long)&remaining._data + 0x18)) {
            operator_delete((void *)remaining._data.short_data[1],remaining._data.short_data[3] + 1)
            ;
          }
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&branch_v);
          if ((undefined1 *)__str._M_string_length != puVar3) {
            operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
          }
          SVOBitset::SVOBitset(&remaining,&pHVar40->values);
          uVar29 = (ulong)remaining.n_words;
          uVar22 = &remaining;
          if (0x10 < uVar29) {
            uVar22 = remaining._data.short_data[0];
          }
          iVar26 = -1;
          if (uVar29 != 0) {
            lVar32 = 0;
            do {
              BVar36 = (((SVOBitset *)uVar22)->_data).short_data[0];
              if (BVar36 != 0) goto LAB_0013886a;
              lVar32 = lVar32 + -0x40;
              uVar22 = (long)&((SVOBitset *)uVar22)->_data + 8;
            } while (uVar29 * 0x40 + lVar32 != 0);
          }
LAB_001387af:
          while (iVar26 != -1) {
            uVar22 = &remaining;
            if (0x10 < remaining.n_words) {
              uVar22 = remaining._data.short_data[0];
            }
            bVar12 = (byte)iVar26 & 0x3f;
            iVar31 = iVar26 + 0x3f;
            if (-1 < iVar26) {
              iVar31 = iVar26;
            }
            (((SVOBitset *)uVar22)->_data).short_data[iVar31 >> 6] =
                 (((SVOBitset *)uVar22)->_data).short_data[iVar31 >> 6] &
                 (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
            ppVar17 = proof_domains.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                      ((NamedVertex *)&__str,this->model,iVar26);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<std::pair<int,std::__cxx11::string>>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)&ppVar17[-1].second,(NamedVertex *)&__str);
            if ((undefined1 *)__str._M_string_length != puVar3) {
              operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
            }
            uVar29 = (ulong)remaining.n_words;
            uVar22 = &remaining;
            if (0x10 < uVar29) {
              uVar22 = remaining._data.short_data[0];
            }
            iVar26 = -1;
            if (uVar29 != 0) {
              lVar32 = 0;
              do {
                BVar36 = (((SVOBitset *)uVar22)->_data).short_data[0];
                if (BVar36 != 0) goto LAB_0013886a;
                lVar32 = lVar32 + -0x40;
                uVar22 = (long)&((SVOBitset *)uVar22)->_data + 8;
              } while (uVar29 * 0x40 + lVar32 != 0);
            }
          }
          if ((0x10 < remaining.n_words) && (remaining._data.short_data[0] != 0)) {
            operator_delete__(remaining._data.long_data);
          }
          pHVar40 = pHVar40 + 1;
          if (pHVar40 == pHVar7) break;
        } while( true );
      }
      uVar38 = -depth;
      if (0 < depth) {
        uVar38 = depth;
      }
      __len = 1;
      if (9 < uVar38) {
        uVar29 = (ulong)uVar38;
        uVar18 = 4;
        do {
          __len = uVar18;
          uVar27 = (uint)uVar29;
          if (uVar27 < 100) {
            __len = __len - 2;
            goto LAB_00138906;
          }
          if (uVar27 < 1000) {
            __len = __len - 1;
            goto LAB_00138906;
          }
          if (uVar27 < 10000) goto LAB_00138906;
          uVar29 = uVar29 / 10000;
          uVar18 = __len + 4;
        } while (99999 < uVar27);
        __len = __len + 1;
      }
LAB_00138906:
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&__str,(ulong)(__len + -(depth >> 0x1f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p + (uint)-(depth >> 0x1f),__len,uVar38);
      pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&__str,0,0,"entering depth ",0xf);
      pBVar4 = (BitWord *)((long)&remaining._data + 0x10);
      remaining._data.short_data[0] = (BitWord)(pbVar23->_M_dataplus)._M_p;
      paVar28 = &pbVar23->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)remaining._data.short_data[0] == paVar28) {
        remaining._data._16_16_ = *(undefined1 (*) [16])paVar28;
        remaining._data.short_data[0] = (BitWord)pBVar4;
      }
      else {
        remaining._data.short_data[2] = paVar28->_M_allocated_capacity;
      }
      remaining._data.short_data[1] = pbVar23->_M_string_length;
      (pbVar23->_M_dataplus)._M_p = (pointer)paVar28;
      pbVar23->_M_string_length = 0;
      (pbVar23->field_2)._M_local_buf[0] = '\0';
      Proof::show_domains(pPVar6,(string *)&remaining,&proof_domains);
      if ((BitWord *)remaining._data.short_data[0] != pBVar4) {
        operator_delete(remaining._data.long_data,remaining._data.short_data[2] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                 __str.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~vector(&proof_domains);
    }
  }
  bVar19 = Timeout::should_abort
                     ((this->params->timeout).
                      super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar19) {
    return Aborted;
  }
  *nodes = *nodes + 1;
  pHVar24 = find_branch_domain(this,local_110);
  if (pHVar24 == (HomomorphismDomain *)0x0) {
    if ((this->params->lackey)._M_t.
        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t
        .super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
        super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl != (Lackey *)0x0) {
      remaining._data.short_data[4] = (BitWord)(&remaining._data.long_data + 1);
      remaining._data.short_data[1] = remaining._data.short_data[1] & 0xffffffff00000000;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = remaining._data.short_data[4];
      remaining._data._16_16_ = auVar14 << 0x40;
      remaining._data.short_data[5] = 0;
      pHVar35 = (assignments->values).
                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar8 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar35 != pHVar8) {
        do {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&remaining,(uint *)pHVar35,&(pHVar35->assignment).target_vertex);
          pHVar35 = pHVar35 + 1;
        } while (pHVar35 != pHVar8);
      }
      __str._M_dataplus._M_p._0_4_ = 0;
      __str._M_dataplus._M_p._4_4_ = 0;
      __str._M_string_length._0_4_ = 0;
      __str._M_string_length._4_4_ = 0;
      __str.field_2._M_allocated_capacity._0_4_ = 0;
      __str.field_2._M_allocated_capacity._4_4_ = 0;
      __str.field_2._8_8_ = 0;
      bVar19 = Lackey::check_solution
                         ((this->params->lackey)._M_t.
                          super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                          .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl,
                          (VertexToVertexMapping *)&remaining,false,this->params->count_solutions,
                          (function<bool_(int,_int)> *)&__str);
      SVar21 = (SearchResult)CONCAT71(extraout_var,bVar19);
      if ((code *)CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                           __str.field_2._M_allocated_capacity._0_4_) != (code *)0x0) {
        (*(code *)CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                           __str.field_2._M_allocated_capacity._0_4_))(&__str,&__str,3);
      }
      if (bVar19) {
LAB_00138b70:
        bVar19 = true;
      }
      else {
        bVar19 = false;
        PVar5 = this->params->propagate_using_lackey;
        if (PVar5 < RootAndBackjump) {
          SVar21 = Unsatisfiable;
          bVar19 = false;
        }
        else {
          if (PVar5 != RootAndBackjump) goto LAB_00138b70;
          SVar21 = UnsatisfiableAndBackjumpUsingLackey;
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&remaining);
      if (!bVar19) {
        return SVar21;
      }
    }
    pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar6 != (Proof *)0x0) {
      solution_in_proof_form_abi_cxx11_
                ((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&remaining,this,assignments);
      Proof::post_solution
                (pPVar6,(vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&remaining);
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&remaining);
    }
    if (this->params->count_solutions != true) {
      return Satisfiable;
    }
    if ((this->_duplicate_solution_filterer).super__Function_base._M_manager == (_Manager_type)0x0)
    {
      std::__throw_bad_function_call();
    }
    bVar19 = (*(this->_duplicate_solution_filterer)._M_invoker)
                       ((_Any_data *)&this->_duplicate_solution_filterer,assignments);
    if (!bVar19) {
      return SatisfiableButKeepGoing;
    }
    remaining._data.short_data[0] = 1;
    bVar19 = (solution_count->m_backend).
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_internal;
    plVar25 = solution_count;
    if (bVar19 == false) {
      plVar25 = (loooong *)
                (solution_count->m_backend).
                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                .m_data.la[1];
    }
    lVar10 = (plVar25->m_backend).
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data.la[0];
    if ((solution_count->m_backend).
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign == false) {
      if (lVar10 != 0xffffffffffffffff) {
        (plVar25->m_backend).
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] = lVar10 + 1;
        goto LAB_00139343;
      }
    }
    else if (lVar10 != 0) {
      (plVar25->m_backend).
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = lVar10 - 1;
      plVar25 = solution_count;
      if (bVar19 == false) {
        plVar25 = (loooong *)
                  (solution_count->m_backend).
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_data.la[1];
      }
      if ((plVar25->m_backend).
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_data.la[0] == 0) {
        (solution_count->m_backend).
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign = false;
      }
      goto LAB_00139343;
    }
    boost::multiprecision::backends::
    eval_add<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              (&solution_count->m_backend,(limb_type *)&remaining);
LAB_00139343:
    if ((this->params->enumerate_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
      remaining._data.short_data[4] = (BitWord)(&remaining._data.long_data + 1);
      remaining._data.short_data[1] = remaining._data.short_data[1] & 0xffffffff00000000;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = remaining._data.short_data[4];
      remaining._data._16_16_ = auVar15 << 0x40;
      remaining._data.short_data[5] = 0;
      pHVar35 = (assignments->values).
                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar8 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar35 != pHVar8) {
        do {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&remaining,(uint *)pHVar35,&(pHVar35->assignment).target_vertex);
          pHVar35 = pHVar35 + 1;
        } while (pHVar35 != pHVar8);
      }
      pHVar11 = this->params;
      if ((pHVar11->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar19 = (*(pHVar11->enumerate_callback)._M_invoker)
                         ((_Any_data *)&pHVar11->enumerate_callback,
                          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&remaining);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&remaining);
      if (!bVar19) {
        return Satisfiable;
      }
    }
    return SatisfiableButKeepGoing;
  }
  SVOBitset::SVOBitset(&remaining,&pHVar24->values);
  __last._M_current = (int *)(ulong)this->model->target_size;
  std::vector<int,_std::allocator<int>_>::vector
            (&branch_v,(size_type)__last._M_current,(allocator_type *)&__str);
  uVar29 = (ulong)remaining.n_words;
  uVar22 = &remaining;
  if (0x10 < uVar29) {
    uVar22 = remaining._data.short_data[0];
  }
  iVar26 = -1;
  if (uVar29 != 0) {
    lVar32 = 0;
LAB_00138a95:
    __last._M_current = (int *)(((SVOBitset *)uVar22)->_data).short_data[0];
    if ((HomomorphismSearcher *)__last._M_current == (HomomorphismSearcher *)0x0)
    goto code_r0x00138aa2;
    iVar26 = 0;
    for (pHVar30 = (HomomorphismSearcher *)__last._M_current; ((ulong)pHVar30 & 1) == 0;
        pHVar30 = (HomomorphismSearcher *)((ulong)pHVar30 >> 1 | 0x8000000000000000)) {
      iVar26 = iVar26 + 1;
    }
    iVar26 = iVar26 - (int)lVar32;
  }
LAB_00138b7f:
  uVar29 = 0;
  uVar38 = 0;
  if (iVar26 != -1) {
    do {
      uVar22 = &remaining;
      if (0x10 < remaining.n_words) {
        uVar22 = remaining._data.short_data[0];
      }
      bVar12 = (byte)iVar26 & 0x3f;
      iVar31 = iVar26 + 0x3f;
      if (-1 < iVar26) {
        iVar31 = iVar26;
      }
      (((SVOBitset *)uVar22)->_data).short_data[iVar31 >> 6] =
           (((SVOBitset *)uVar22)->_data).short_data[iVar31 >> 6] &
           (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
      branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar29] = iVar26;
      __last._M_current = (int *)(ulong)remaining.n_words;
      uVar22 = &remaining;
      if ((HomomorphismSearcher *)0x10 < __last._M_current) {
        uVar22 = remaining._data.short_data[0];
      }
      iVar26 = -1;
      if ((HomomorphismSearcher *)__last._M_current != (HomomorphismSearcher *)0x0) {
        __last._M_current = (int *)((long)__last._M_current * 0x40);
        lVar32 = 0;
LAB_00138bfb:
        uVar9 = (((SVOBitset *)uVar22)->_data).short_data[0];
        if (uVar9 == 0) goto code_r0x00138c03;
        iVar26 = 0;
        for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          iVar26 = iVar26 + 1;
        }
        iVar26 = iVar26 - (int)lVar32;
      }
LAB_00138c1d:
      uVar38 = (int)uVar29 + 1;
      uVar29 = (ulong)uVar38;
    } while (iVar26 != -1);
  }
  switch(this->params->value_ordering_heuristic) {
  case Biased:
    __last._M_current = (int *)&branch_v;
    softmax_shuffle(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar38);
    break;
  case Degree:
    bVar19 = false;
    goto LAB_00138c7b;
  case AntiDegree:
    bVar19 = true;
LAB_00138c7b:
    __last._M_current = (int *)&branch_v;
    degree_sort(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar38,bVar19);
    break;
  case Random:
    __last._M_current =
         branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + uVar38;
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,__last,&this->global_rand);
  }
  local_14c = 0;
  bVar19 = uVar38 == 0;
  if (bVar19) {
    SVar21 = Unsatisfiable;
    bVar39 = false;
  }
  else {
    puVar2 = (uint *)(branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar38);
    iVar26 = depth + 2;
    local_118 = (HomomorphismSearcher *)(ulong)(depth + 1);
    bVar20 = false;
    bVar39 = false;
    puVar42 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar6 != (Proof *)0x0) {
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&__str,this->model,pHVar24->v);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&proof_domains,this->model,*puVar42);
        Proof::guessing(pPVar6,depth,(NamedVertex *)&__str,(NamedVertex *)&proof_domains);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)proof_domains.
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != &local_130) {
          operator_delete(proof_domains.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (ulong)(local_130._M_allocated_capacity + 1));
        }
        if ((void *)__str._M_string_length != (void *)((long)&__str.field_2 + 8)) {
          operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
        }
      }
      iVar33._M_current =
           (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lVar32 = (long)iVar33._M_current -
               (long)(assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      __str._M_dataplus._M_p._0_4_ = pHVar24->v;
      __str._M_dataplus._M_p._4_4_ = *puVar42;
      __str._M_string_length._0_1_ = 1;
      __str._M_string_length._4_4_ = local_14c;
      __str.field_2._M_allocated_capacity._0_4_ = uVar38;
      if (iVar33._M_current ==
          (assignments->values).
          super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
                  (&assignments->values,iVar33,(HomomorphismAssignmentInformation *)&__str);
      }
      else {
        (iVar33._M_current)->choice_count = uVar38;
        ((iVar33._M_current)->assignment).pattern_vertex = (uint)__str._M_dataplus._M_p;
        ((iVar33._M_current)->assignment).target_vertex = __str._M_dataplus._M_p._4_4_;
        (iVar33._M_current)->is_decision = true;
        *(int3 *)&(iVar33._M_current)->field_0x9 =
             (int3)((uint)(undefined4)__str._M_string_length >> 8);
        (iVar33._M_current)->discrepancy_count = local_14c;
        ppHVar1 = &(assignments->values).
                   super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      copy_nonfixed_domains_and_make_assignment
                (&new_domains,(HomomorphismSearcher *)iVar33._M_current,local_110,pHVar24->v,
                 *puVar42);
      *propagations = *propagations + 1;
      bVar43 = true;
      if (!bVar20) {
        bVar43 = this->params->propagate_using_lackey == Always;
      }
      pHVar34 = (HomomorphismSearcher *)0x0;
      bVar43 = propagate(this,false,&new_domains,assignments,bVar43);
      pHVar30 = (HomomorphismSearcher *)((lVar32 >> 2) * -0x3333333333333333);
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (!bVar43) {
        if (pPVar6 != (Proof *)0x0) {
          assignments_as_proof_decisions(&local_60,pHVar34,assignments);
          HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&__str,this->model,pHVar24->v);
          HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&proof_domains,this->model,*puVar42);
          Proof::propagation_failure
                    (pPVar6,&local_60,(NamedVertex *)&__str,(NamedVertex *)&proof_domains);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)proof_domains.
                 super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish != &local_130) {
            operator_delete(proof_domains.
                            super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (ulong)(local_130._M_allocated_capacity + 1));
          }
          if ((void *)CONCAT44(__str._M_string_length._4_4_,(undefined4)__str._M_string_length) !=
              (void *)((long)&__str.field_2 + 8)) {
            operator_delete((void *)CONCAT44(__str._M_string_length._4_4_,
                                             (undefined4)__str._M_string_length),
                            __str.field_2._8_8_ + 1);
          }
          if (local_60.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)pHVar30);
        iVar31 = 0xe;
        bVar39 = true;
        __last._M_current = (int *)pHVar30;
        goto LAB_00139112;
      }
      if (pPVar6 != (Proof *)0x0) {
        Proof::start_level(pPVar6,iVar26);
      }
      __last._M_current = (int *)assignments;
      SVar21 = restarting_search(this,assignments,&new_domains,nodes,propagations,solution_count,
                                 (int)local_118,restarts_schedule);
      iVar31 = 1;
      switch(SVar21) {
      case Aborted:
      case Satisfiable:
        local_150 = SVar21;
        goto LAB_00139112;
      case UnsatisfiableAndBackjumpUsingLackey:
        bVar20 = true;
      case Unsatisfiable:
        pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar6 != (Proof *)0x0) {
          pHVar34 = local_118;
          Proof::back_up_to_level(pPVar6,(int)local_118);
          pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          assignments_as_proof_decisions
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
                     pHVar34,assignments);
          Proof::incorrect_guess
                    (pPVar6,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &__str,true);
          pvVar13 = (void *)CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
          if (pvVar13 != (void *)0x0) {
            operator_delete(pvVar13,CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                             __str.field_2._M_allocated_capacity._0_4_) -
                                    (long)pvVar13);
          }
          Proof::forget_level((this->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar26);
        }
        bVar39 = true;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)pHVar30);
        __last._M_current = (int *)pHVar30;
        break;
      case SatisfiableButKeepGoing:
        pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar6 != (Proof *)0x0) {
          pHVar34 = local_118;
          Proof::back_up_to_level(pPVar6,(int)local_118);
          pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          assignments_as_proof_decisions
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
                     pHVar34,assignments);
          Proof::incorrect_guess
                    (pPVar6,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &__str,false);
          pvVar13 = (void *)CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
          if (pvVar13 != (void *)0x0) {
            operator_delete(pvVar13,CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                             __str.field_2._M_allocated_capacity._0_4_) -
                                    (long)pvVar13);
          }
          Proof::forget_level((this->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar26);
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)pHVar30);
        __last._M_current = (int *)pHVar30;
        break;
      case Restart:
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)pHVar30);
        local_150 = Restart;
        for (puVar37 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start; iVar31 = 1,
            __last._M_current = (int *)pHVar30, puVar37 != puVar42; puVar37 = puVar37 + 1) {
          __str._M_dataplus._M_p._0_4_ = pHVar24->v;
          __str._M_dataplus._M_p._4_4_ = *puVar37;
          __str._M_string_length._1_3_ = (undefined3)((uint)(undefined4)__str._M_string_length >> 8)
          ;
          __str._M_string_length._0_1_ = 1;
          __str._M_string_length._4_4_ = -2;
          __str.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
          iVar33._M_current =
               (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar33._M_current ==
              (assignments->values).
              super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
                      (&assignments->values,iVar33,(HomomorphismAssignmentInformation *)&__str);
          }
          else {
            (iVar33._M_current)->choice_count = -2;
            ((iVar33._M_current)->assignment).pattern_vertex = (uint)__str._M_dataplus._M_p;
            ((iVar33._M_current)->assignment).target_vertex = __str._M_dataplus._M_p._4_4_;
            (iVar33._M_current)->is_decision = true;
            *(int3 *)&(iVar33._M_current)->field_0x9 =
                 (int3)((uint)(undefined4)__str._M_string_length >> 8);
            (iVar33._M_current)->discrepancy_count = 0xfffffffe;
            ppHVar1 = &(assignments->values).
                       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppHVar1 = *ppHVar1 + 1;
          }
          pHVar30 = (HomomorphismSearcher *)assignments;
          post_nogood(this,assignments);
          ppHVar1 = &(assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppHVar1 = *ppHVar1 + -1;
        }
        goto LAB_00139112;
      }
      local_14c = local_14c + 1;
      iVar31 = 0;
LAB_00139112:
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      ~vector(&new_domains);
      if ((iVar31 != 0xe) && (iVar31 != 0)) break;
      puVar42 = puVar42 + 1;
      bVar19 = puVar42 == puVar2;
    } while (!bVar19);
    SVar21 = bVar20 + Unsatisfiable;
    pHVar24 = (HomomorphismDomain *)(ulong)(uint)local_150;
  }
  SVar41 = (SearchResult)pHVar24;
  if (bVar19) {
    pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar6 != (Proof *)0x0) {
      assignments_as_proof_decisions
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
                 (HomomorphismSearcher *)__last._M_current,assignments);
      Proof::out_of_guesses
                (pPVar6,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str
                );
      if (__str._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                 __str.field_2._M_allocated_capacity._0_4_) -
                        (long)__str._M_dataplus._M_p);
      }
    }
    if (bVar39) {
      (*restarts_schedule->_vptr_RestartsSchedule[2])();
    }
    iVar26 = (*restarts_schedule->_vptr_RestartsSchedule[4])();
    SVar41 = SVar21;
    if ((char)iVar26 != '\0') {
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar6 != (Proof *)0x0) {
        Proof::back_up_to_top(pPVar6);
      }
      SVar41 = Restart;
      post_nogood(this,assignments);
    }
  }
  if (branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((0x10 < remaining.n_words) && (remaining._data.short_data[0] != 0)) {
    operator_delete__(remaining._data.long_data);
  }
  return SVar41;
LAB_0013886a:
  iVar26 = 0;
  for (; (BVar36 & 1) == 0; BVar36 = BVar36 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  iVar26 = iVar26 - (int)lVar32;
  goto LAB_001387af;
code_r0x00138aa2:
  lVar32 = lVar32 + -0x40;
  uVar22 = (long)&((SVOBitset *)uVar22)->_data + 8;
  if (uVar29 * 0x40 + lVar32 == 0) goto code_r0x00138ab2;
  goto LAB_00138a95;
code_r0x00138ab2:
  __last._M_current = (int *)0x0;
  goto LAB_00138b7f;
code_r0x00138c03:
  uVar22 = (long)&((SVOBitset *)uVar22)->_data + 8;
  lVar16 = lVar32 + -0x80;
  lVar32 = lVar32 + -0x40;
  if ((long)(((HomomorphismSearcher *)__last._M_current)->global_rand)._M_x + lVar16 == 0)
  goto LAB_00138c1d;
  goto LAB_00138bfb;
}

Assistant:

auto HomomorphismSearcher::restarting_search(
    HomomorphismAssignments & assignments,
    const Domains & domains,
    unsigned long long & nodes,
    unsigned long long & propagations,
    loooong & solution_count,
    int depth,
    RestartsSchedule & restarts_schedule) -> SearchResult
{
    if (proof && proof->super_extra_verbose()) {
        vector<pair<NamedVertex, vector<NamedVertex>>> proof_domains;
        for (auto & d : domains) {
            proof_domains.push_back(pair{model.pattern_vertex_for_proof(d.v), vector<NamedVertex>{}});
            auto values = d.values;
            for (auto v = values.find_first(); v != decltype(values)::npos; v = values.find_first()) {
                values.reset(v);
                proof_domains.back().second.push_back(model.target_vertex_for_proof(v));
            }
        }
        proof->show_domains("entering depth " + to_string(depth), proof_domains);
    }

    if (params.timeout->should_abort())
        return SearchResult::Aborted;

    ++nodes;

    // find ourselves a domain, or succeed if we're all assigned
    const HomomorphismDomain * branch_domain = find_branch_domain(domains);
    if (! branch_domain) {
        if (params.lackey) {
            VertexToVertexMapping mapping;
            expand_to_full_result(assignments, mapping);
            if (! params.lackey->check_solution(mapping, false, params.count_solutions, {})) {
                switch (params.propagate_using_lackey) {
                case PropagateUsingLackey::RootAndBackjump:
                    return SearchResult::UnsatisfiableAndBackjumpUsingLackey;
                case PropagateUsingLackey::Never:
                case PropagateUsingLackey::Root:
                case PropagateUsingLackey::Always:
                    return SearchResult::Unsatisfiable;
                }
            }
        }

        if (proof)
            proof->post_solution(solution_in_proof_form(assignments));

        if (params.count_solutions) {
            // we could be finding duplicate solutions, in threaded search
            if (_duplicate_solution_filterer(assignments)) {
                ++solution_count;
                if (params.enumerate_callback) {
                    VertexToVertexMapping mapping;
                    expand_to_full_result(assignments, mapping);
                    if (! params.enumerate_callback(mapping))
                        return SearchResult::Satisfiable;
                }
            }

            return SearchResult::SatisfiableButKeepGoing;
        }
        else
            return SearchResult::Satisfiable;
    }

    // pull out the remaining values in this domain for branching
    auto remaining = branch_domain->values;

    vector<int> branch_v(model.target_size);

    unsigned branch_v_end = 0;
    for (auto f_v = remaining.find_first(); f_v != decltype(remaining)::npos; f_v = remaining.find_first()) {
        remaining.reset(f_v);
        branch_v[branch_v_end++] = f_v;
    }

    switch (params.value_ordering_heuristic) {
    case ValueOrdering::None:
        break;

    case ValueOrdering::Degree:
        degree_sort(branch_v, branch_v_end, false);
        break;

    case ValueOrdering::AntiDegree:
        degree_sort(branch_v, branch_v_end, true);
        break;

    case ValueOrdering::Biased:
        softmax_shuffle(branch_v, branch_v_end);
        break;

    case ValueOrdering::Random:
        shuffle(branch_v.begin(), branch_v.begin() + branch_v_end, global_rand);
        break;
    }

    int discrepancy_count = 0;
    bool actually_hit_a_failure = false;

    // override whether we use the lackey for propagation, in case we are inside a backjump
    bool use_lackey_for_propagation = false;

    // for each value remaining...
    for (auto f_v = branch_v.begin(), f_end = branch_v.begin() + branch_v_end; f_v != f_end; ++f_v) {
        if (proof)
            proof->guessing(depth, model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

        // modified in-place by appending, we can restore by shrinking
        auto assignments_size = assignments.values.size();

        // make the assignment
        assignments.values.push_back({{branch_domain->v, unsigned(*f_v)}, true, discrepancy_count, int(branch_v_end)});

        // set up new domains
        Domains new_domains = copy_nonfixed_domains_and_make_assignment(domains, branch_domain->v, *f_v);

        // propagate
        ++propagations;
        if (! propagate(false, new_domains, assignments, use_lackey_for_propagation || (params.propagate_using_lackey == PropagateUsingLackey::Always))) {
            // failure? restore assignments and go on to the next thing
            if (proof)
                proof->propagation_failure(assignments_as_proof_decisions(assignments), model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;

            continue;
        }

        if (proof)
            proof->start_level(depth + 2);

        // recursive search
        auto search_result = restarting_search(assignments, new_domains, nodes, propagations,
            solution_count, depth + 1, restarts_schedule);

        switch (search_result) {
        case SearchResult::Satisfiable:
            return SearchResult::Satisfiable;

        case SearchResult::Aborted:
            return SearchResult::Aborted;

        case SearchResult::Restart:
            // restore assignments before posting nogoods, it's easier
            assignments.values.resize(assignments_size);

            // post nogoods for everything we've done so far
            for (auto l = branch_v.begin(); l != f_v; ++l) {
                assignments.values.push_back({{branch_domain->v, unsigned(*l)}, true, -2, -2});
                post_nogood(assignments);
                assignments.values.pop_back();
            }

            return SearchResult::Restart;

        case SearchResult::SatisfiableButKeepGoing:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), false);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            break;

        case SearchResult::UnsatisfiableAndBackjumpUsingLackey:
            use_lackey_for_propagation = true;
            [[std::fallthrough]];

        case SearchResult::Unsatisfiable:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), true);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;
            break;
        }

        ++discrepancy_count;
    }

    // no values remaining, backtrack, or possibly kick off a restart
    if (proof)
        proof->out_of_guesses(assignments_as_proof_decisions(assignments));

    if (actually_hit_a_failure)
        restarts_schedule.did_a_backtrack();

    if (restarts_schedule.should_restart()) {
        if (proof)
            proof->back_up_to_top();
        post_nogood(assignments);
        return SearchResult::Restart;
    }
    else
        return use_lackey_for_propagation ? SearchResult::UnsatisfiableAndBackjumpUsingLackey : SearchResult::Unsatisfiable;
}